

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::XercesDOMParser::loadGrammar
          (XercesDOMParser *this,XMLCh *systemId,GrammarType grammarType,bool toCache)

{
  bool bVar1;
  IOException *this_00;
  XMLScanner *pXVar2;
  Grammar *pGVar3;
  OutOfMemoryException *anon_var_0;
  Grammar *grammar;
  undefined1 local_48 [8];
  ResetParseType_conflict resetParse;
  short local_1c;
  bool toCache_local;
  GrammarType grammarType_local;
  XMLCh *systemId_local;
  XercesDOMParser *this_local;
  
  bVar1 = AbstractDOMParser::getParseInProgress(&this->super_AbstractDOMParser);
  if (!bVar1) {
    JanitorMemFunCall<xercesc_4_0::XercesDOMParser>::JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::XercesDOMParser> *)local_48,this,
               (MFPT)XercesDOMParser::resetParse);
    AbstractDOMParser::setParseInProgress(&this->super_AbstractDOMParser,true);
    if (grammarType == DTDGrammarType) {
      pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
      XMLScanner::setDocTypeHandler(pXVar2,(DocTypeHandler *)0x0);
    }
    pXVar2 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
    local_1c = (short)grammarType;
    pGVar3 = XMLScanner::loadGrammar(pXVar2,systemId,local_1c,toCache);
    JanitorMemFunCall<xercesc_4_0::XercesDOMParser>::~JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::XercesDOMParser> *)local_48);
    return pGVar3;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/XercesDOMParser.cpp"
             ,0x119,Gen_ParseInProgress,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

Grammar* XercesDOMParser::loadGrammar(const XMLCh* const systemId,
                                      const Grammar::GrammarType grammarType,
                                      const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &XercesDOMParser::resetParse);

    Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}